

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManStop(Sbd_Man_t *p)

{
  int local_14;
  int i;
  Sbd_Man_t *p_local;
  
  Vec_WecFree(p->vTfos);
  Vec_IntFree(p->vLutLevs);
  Vec_IntFree(p->vLutCuts);
  Vec_IntFree(p->vMirrors);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    Vec_WrdFree(p->vSims[local_14]);
  }
  Vec_IntFree(p->vCover);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vLits2);
  Vec_IntFree(p->vRoots);
  Vec_IntFree(p->vWinObjs);
  Vec_IntFree(p->vObj2Var);
  Vec_IntFree(p->vDivSet);
  Vec_IntFree(p->vDivVars);
  Vec_IntFree(p->vDivValues);
  Vec_WecFree(p->vDivLevels);
  Vec_IntFree(p->vCounts[0]);
  Vec_IntFree(p->vCounts[1]);
  Vec_WrdFree(p->vMatrix);
  sat_solver_delete_p(&p->pSat);
  if (p->pSto != (Sbd_Sto_t *)0x0) {
    Sbd_StoFree(p->pSto);
  }
  if (p->pSrv != (Sbd_Srv_t *)0x0) {
    Sbd_ManCutServerStop(p->pSrv);
  }
  if (p != (Sbd_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sbd_ManStop( Sbd_Man_t * p )
{
    int i;
    Vec_WecFree( p->vTfos );
    Vec_IntFree( p->vLutLevs );
    Vec_IntFree( p->vLutCuts );
    Vec_IntFree( p->vMirrors );
    for ( i = 0; i < 4; i++ )
        Vec_WrdFree( p->vSims[i] );
    Vec_IntFree( p->vCover );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vLits2 );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vWinObjs );
    Vec_IntFree( p->vObj2Var );
    Vec_IntFree( p->vDivSet );
    Vec_IntFree( p->vDivVars );
    Vec_IntFree( p->vDivValues );
    Vec_WecFree( p->vDivLevels );
    Vec_IntFree( p->vCounts[0] );
    Vec_IntFree( p->vCounts[1] );
    Vec_WrdFree( p->vMatrix );
    sat_solver_delete_p( &p->pSat );
    if ( p->pSto ) Sbd_StoFree( p->pSto );
    if ( p->pSrv ) Sbd_ManCutServerStop( p->pSrv );
    ABC_FREE( p );
}